

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int boost::filesystem::detail::lex_compare
              (iterator *first1,iterator *last1,iterator *first2,iterator *last2)

{
  path *ppVar1;
  size_type sVar2;
  bool bVar3;
  __type _Var4;
  path *ppVar5;
  int iVar6;
  size_type sVar7;
  
  iVar6 = 1;
  while( true ) {
    ppVar1 = first1->m_path_ptr;
    sVar2 = first1->m_pos;
    ppVar5 = ppVar1;
    sVar7 = sVar2;
    if ((sVar2 == last1->m_pos && ppVar1 == last1->m_path_ptr) ||
       ((first2->m_path_ptr == last2->m_path_ptr &&
        (ppVar5 = last1->m_path_ptr, sVar7 = last1->m_pos, first2->m_pos == last2->m_pos)))) {
      if (sVar2 == sVar7 && ppVar1 == ppVar5) {
        iVar6 = -(uint)(last2->m_pos != first2->m_pos || first2->m_path_ptr != last2->m_path_ptr);
      }
      return iVar6;
    }
    bVar3 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           first1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)first2);
    if (bVar3) {
      return -1;
    }
    bVar3 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           first2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)first1);
    if (bVar3) break;
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            first2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)first1);
    if (!_Var4) {
      __assert_fail("first2->native() == first1->native()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                    ,699,
                    "int boost::filesystem::detail::lex_compare(path::iterator, path::iterator, path::iterator, path::iterator)"
                   );
    }
    path::m_path_iterator_increment(first1);
    path::m_path_iterator_increment(first2);
  }
  return 1;
}

Assistant:

BOOST_FILESYSTEM_DECL
      int lex_compare(path::iterator first1, path::iterator last1,
        path::iterator first2, path::iterator last2)
    {
      for (; first1 != last1 && first2 != last2;)
      {
        if (first1->native() < first2->native()) return -1;
        if (first2->native() < first1->native()) return 1;
        BOOST_ASSERT(first2->native() == first1->native());
        ++first1;
        ++first2;
      }
      if (first1 == last1 && first2 == last2)
        return 0;
      return first1 == last1 ? -1 : 1;
    }